

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mcpl.c
# Opt level: O3

void mcpl_enable_polarisation(mcpl_outfile_t of)

{
  mcpl_outfileinternal_t *f;
  
  if (*(int *)((long)of.internal + 0x4c) != 0) {
    return;
  }
  if (*(int *)((long)of.internal + 0x60) != 0) {
    *(undefined4 *)((long)of.internal + 0x4c) = 1;
    mcpl_recalc_psize(of);
    return;
  }
  (*mcpl_error_handler)("mcpl_enable_polarisation called too late.");
  printf("MCPL ERROR: %s\n",
         "Handler given to mcpl_set_error_handler returns to calling code which is not allowed!");
  exit(1);
}

Assistant:

void mcpl_enable_polarisation(mcpl_outfile_t of)
{
  MCPLIMP_OUTFILEDECODE;
  if (f->opt_polarisation)
    return;
  if (!f->header_notwritten)
    mcpl_error("mcpl_enable_polarisation called too late.");
  f->opt_polarisation = 1;
  mcpl_recalc_psize(of);
}